

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O3

int cinatra::detail::phr_parse_request
              (char *buf_start,size_t len,char **method,size_t *method_len,char **path,
              size_t *path_len,int *minor_version,http_header *headers,size_t *num_headers,
              size_t last_len,bool *has_connection,bool *has_close,bool *has_upgrade,bool *has_query
              )

{
  byte *buf_end;
  byte bVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  byte *pbVar5;
  int iVar6;
  size_t sVar7;
  byte *pbVar8;
  int r;
  size_t local_38;
  
  buf_end = (byte *)(buf_start + len);
  local_38 = *num_headers;
  iVar6 = 0;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;
  if (last_len != 0) {
    pbVar5 = (byte *)(buf_start + (last_len - 3));
    if (last_len < 3) {
      pbVar5 = (byte *)buf_start;
    }
    do {
      if (pbVar5 == buf_end) {
        return -2;
      }
      pbVar8 = pbVar5 + 1;
      if (*pbVar5 == 10) {
LAB_00123995:
        iVar3 = iVar6 + 1;
      }
      else {
        iVar3 = 0;
        if (*pbVar5 == 0xd) {
          if (pbVar8 == buf_end) {
            return -2;
          }
          if (*pbVar8 != 10) {
            return -1;
          }
          pbVar8 = pbVar5 + 2;
          goto LAB_00123995;
        }
      }
      iVar6 = iVar3;
      pbVar5 = pbVar8;
    } while (iVar6 != 2);
  }
  if (last_len == len) {
    return -2;
  }
  pbVar5 = (byte *)(buf_start + last_len);
  if (*pbVar5 == 10) {
    pbVar5 = pbVar5 + 1;
  }
  else if (*pbVar5 == 0xd) {
    if (pbVar5 + 1 == buf_end) {
      return -2;
    }
    if (pbVar5[1] != 10) {
      return -1;
    }
    pbVar5 = pbVar5 + 2;
  }
  if (pbVar5 == buf_end) {
    return -2;
  }
  sVar7 = 0;
  do {
    bVar1 = pbVar5[sVar7];
    if (bVar1 == 0x20) {
      *method = (char *)pbVar5;
      *method_len = sVar7;
      pbVar5 = pbVar5 + sVar7 + 1;
      if (pbVar5 == buf_end) {
        return -2;
      }
      sVar7 = 0;
      pbVar8 = pbVar5;
      do {
        bVar1 = *pbVar8;
        if (bVar1 == 0x20) {
          *path = (char *)pbVar5;
          *path_len = sVar7;
          pcVar4 = parse_http_version((char *)(pbVar8 + 1),(char *)buf_end,minor_version,&r);
          if (pcVar4 == (char *)0x0) {
            return r;
          }
          if (*pcVar4 == '\n') {
            pcVar4 = pcVar4 + 1;
          }
          else {
            if (*pcVar4 != '\r') {
              return -1;
            }
            if ((byte *)(pcVar4 + 1) == buf_end) {
              return -2;
            }
            if (pcVar4[1] != '\n') {
              return -1;
            }
            pcVar4 = pcVar4 + 2;
          }
          pcVar4 = parse_headers(pcVar4,(char *)buf_end,headers,num_headers,local_38,&r,
                                 has_connection,has_close,has_upgrade);
          if (pcVar4 != (char *)0x0) {
            return (int)pcVar4 - ((int)buf_start + (int)last_len);
          }
          return r;
        }
        if (bVar1 - 0x7f < 0xffffffa1) {
          if (bVar1 < 0x20) {
            return -1;
          }
          if (bVar1 == 0x7f) {
            return -1;
          }
        }
        else if (bVar1 == 0x3f) {
          *has_query = true;
        }
        pbVar8 = pbVar8 + 1;
        sVar7 = sVar7 + 1;
        if (pbVar8 == buf_end) {
          return -2;
        }
      } while( true );
    }
    if (bVar1 - 0x7f < 0xffffffa1) {
      if (bVar1 < 0x20) {
        return -1;
      }
      if (bVar1 == 0x7f) {
        return -1;
      }
    }
    lVar2 = sVar7 + 1;
    sVar7 = sVar7 + 1;
    if (pbVar5 + lVar2 == buf_end) {
      return -2;
    }
  } while( true );
}

Assistant:

inline int phr_parse_request(const char *buf_start, size_t len,
                             const char **method, size_t *method_len,
                             const char **path, size_t *path_len,
                             int *minor_version, http_header *headers,
                             size_t *num_headers, size_t last_len,
                             bool &has_connection, bool &has_close,
                             bool &has_upgrade, bool &has_query) {
  const char *buf = buf_start, *buf_end = buf_start + len;
  size_t max_headers = *num_headers;
  int r;

  *method = NULL;
  *method_len = 0;
  *path = NULL;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;

  /* if last_len != 0, check if the request is complete (a fast countermeasure
  againt slowloris */
  if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
    return r;
  }

  if ((buf = parse_request(buf + last_len, buf_end, method, method_len, path,
                           path_len, minor_version, headers, num_headers,
                           max_headers, &r, has_connection, has_close,
                           has_upgrade, has_query)) == NULL) {
    return r;
  }

  return (int)(buf - buf_start - last_len);
}